

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall t_cpp_generator::generate_service_helpers(t_cpp_generator *this,t_service *tservice)

{
  t_struct *tstruct;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar3;
  undefined4 extraout_var_01;
  long *plVar4;
  ofstream_with_content_based_conditional_update *out;
  pointer pptVar5;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  ofstream_with_content_based_conditional_update *local_78;
  ofstream_with_content_based_conditional_update *local_70;
  string name_orig;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  local_70 = &this->f_service_;
  out = &this->f_service_tcc_;
  if (this->gen_templates_ == false) {
    out = local_70;
  }
  if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_78 = &this->f_header_;
    pptVar5 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      tstruct = (*pptVar5)->arglist_;
      iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      name_orig._M_dataplus._M_p = (pointer)&name_orig.field_2;
      lVar1 = *(long *)CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name_orig,lVar1,((long *)CONCAT44(extraout_var,iVar2))[1] + lVar1);
      iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
      local_98[0] = local_88;
      lVar1 = *(long *)CONCAT44(extraout_var_00,iVar2);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,lVar1,((long *)CONCAT44(extraout_var_00,iVar2))[1] + lVar1);
      std::__cxx11::string::append((char *)local_98);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_98,(ulong)((*pptVar5)->name_)._M_dataplus._M_p);
      local_d8 = &local_c8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_c8 = *plVar4;
        lStack_c0 = plVar3[3];
      }
      else {
        local_c8 = *plVar4;
        local_d8 = (long *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_a8 = *plVar4;
        uStack_a0 = (undefined4)plVar3[3];
        uStack_9c = *(undefined4 *)((long)plVar3 + 0x1c);
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*plVar3;
      }
      local_b0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      generate_struct_declaration
                (this,(ostream *)local_78,tstruct,false,false,true,true,false,false);
      generate_struct_definition(this,(ostream *)out,(ostream *)local_70,tstruct,false,false);
      generate_struct_reader(this,(ostream *)out,tstruct,false);
      generate_struct_writer(this,(ostream *)out,tstruct,false);
      iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
      local_98[0] = local_88;
      lVar1 = *(long *)CONCAT44(extraout_var_01,iVar2);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,lVar1,((long *)CONCAT44(extraout_var_01,iVar2))[1] + lVar1);
      std::__cxx11::string::append((char *)local_98);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_98,(ulong)((*pptVar5)->name_)._M_dataplus._M_p);
      local_d8 = &local_c8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_c8 = *plVar4;
        lStack_c0 = plVar3[3];
      }
      else {
        local_c8 = *plVar4;
        local_d8 = (long *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8 = &local_a8;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_a8 = *plVar4;
        uStack_a0 = (undefined4)plVar3[3];
        uStack_9c = *(undefined4 *)((long)plVar3 + 0x1c);
      }
      else {
        local_a8 = *plVar4;
        local_b8 = (long *)*plVar3;
      }
      local_b0 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
      generate_struct_declaration
                (this,(ostream *)local_78,tstruct,false,true,false,true,false,false);
      generate_struct_definition(this,(ostream *)out,(ostream *)local_70,tstruct,false,false);
      generate_struct_writer(this,(ostream *)out,tstruct,true);
      (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[2])(tstruct,&name_orig);
      generate_function_helpers(this,tservice,*pptVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_orig._M_dataplus._M_p != &name_orig.field_2) {
        operator_delete(name_orig._M_dataplus._M_p);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_helpers(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  std::ostream& out = (gen_templates_ ? f_service_tcc_ : f_service_);

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    string name_orig = ts->get_name();

    // TODO(dreiss): Why is this stuff not in generate_function_helpers?
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_args");
    generate_struct_declaration(f_header_, ts, false);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_reader(out, ts);
    generate_struct_writer(out, ts);
    ts->set_name(tservice->get_name() + "_" + (*f_iter)->get_name() + "_pargs");
    generate_struct_declaration(f_header_, ts, false, true, false, true);
    generate_struct_definition(out, f_service_, ts, false);
    generate_struct_writer(out, ts, true);
    ts->set_name(name_orig);

    generate_function_helpers(tservice, *f_iter);
  }
}